

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_ItemSimilarityRecommender_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003e3dd0 == '\x01') {
    DAT_003e3dd0 = '\0';
    (*(code *)*_ItemSimilarityRecommender_ConnectedItem_default_instance_)();
  }
  if (DAT_003e3e18 == '\x01') {
    DAT_003e3e18 = '\0';
    (*(code *)*_ItemSimilarityRecommender_SimilarItems_default_instance_)();
  }
  if (DAT_003e3e90 == '\x01') {
    DAT_003e3e90 = 0;
    (*(code *)*_ItemSimilarityRecommender_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _ItemSimilarityRecommender_ConnectedItem_default_instance_.Shutdown();
  _ItemSimilarityRecommender_SimilarItems_default_instance_.Shutdown();
  _ItemSimilarityRecommender_default_instance_.Shutdown();
}